

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger default_delegate_tointeger(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQRESULT SVar5;
  SQInteger local_b0;
  SQInteger local_a0;
  SQObjectPtr local_80;
  SQObjectPtr local_70;
  int local_5c;
  SQObjectPtr local_58 [2];
  undefined1 local_38 [8];
  SQObjectPtr res;
  SQInteger base;
  SQObjectPtr *o;
  HSQUIRRELVM v_local;
  
  pSVar3 = stack_get(v,1);
  res.super_SQObject._unVal.nInteger = 10;
  SVar4 = sq_gettop(v);
  if (1 < SVar4) {
    sq_getinteger(v,2,&res.super_SQObject._unVal.nInteger);
  }
  SVar1 = (pSVar3->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    SQObjectPtr::SQObjectPtr
              (&local_80,(ulong)((pSVar3->super_SQObject)._unVal.pTable != (SQTable *)0x0));
    SQVM::Push(v,&local_80);
    SQObjectPtr::~SQObjectPtr(&local_80);
  }
  else if ((SVar1 == OT_INTEGER) || (SVar1 == OT_FLOAT)) {
    if ((pSVar3->super_SQObject)._type == OT_FLOAT) {
      local_b0 = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
    }
    else {
      local_b0 = (pSVar3->super_SQObject)._unVal.nInteger;
    }
    SQObjectPtr::SQObjectPtr(&local_70,local_b0);
    SQVM::Push(v,&local_70);
    SQObjectPtr::~SQObjectPtr(&local_70);
  }
  else if (SVar1 == OT_STRING) {
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
    bVar2 = str2num(((pSVar3->super_SQObject)._unVal.pString)->_val,(SQObjectPtr *)local_38,
                    res.super_SQObject._unVal.nInteger);
    if (bVar2) {
      if (local_38._0_4_ == OT_FLOAT) {
        local_a0 = (SQInteger)(float)res.super_SQObject._type;
      }
      else {
        local_a0 = CONCAT44(res.super_SQObject._4_4_,res.super_SQObject._type);
      }
      SQObjectPtr::SQObjectPtr(local_58,local_a0);
      SQVM::Push(v,local_58);
      SQObjectPtr::~SQObjectPtr(local_58);
      local_5c = 2;
    }
    else {
      local_5c = 0;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
    if (local_5c == 0) {
      SVar5 = sq_throwerror(v,"cannot convert the string");
      return SVar5;
    }
  }
  else {
    SQVM::PushNull(v);
  }
  return 1;
}

Assistant:

static SQInteger default_delegate_tointeger(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    SQInteger base = 10;
    if(sq_gettop(v) > 1) {
        sq_getinteger(v,2,&base);
    }
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,base)){
            v->Push(SQObjectPtr(tointeger(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tointeger(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr(_integer(o)?(SQInteger)1:(SQInteger)0));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}